

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

int32_t __thiscall
icu_63::RuleBasedCollator::getSortKey
          (RuleBasedCollator *this,UnicodeString *s,uint8_t *dest,int32_t capacity)

{
  short sVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  char16_t *pcVar3;
  uint uVar4;
  
  pcVar3 = UnicodeString::getBuffer(s);
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (s->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  UNRECOVERED_JUMPTABLE = (this->super_Collator).super_UObject._vptr_UObject[0x22];
  iVar2 = (*UNRECOVERED_JUMPTABLE)
                    (this,pcVar3,(ulong)uVar4,dest,(ulong)(uint)capacity,UNRECOVERED_JUMPTABLE);
  return iVar2;
}

Assistant:

int32_t
RuleBasedCollator::getSortKey(const UnicodeString &s,
                              uint8_t *dest, int32_t capacity) const {
    return getSortKey(s.getBuffer(), s.length(), dest, capacity);
}